

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.cpp
# Opt level: O0

DOMElement * __thiscall
xercesc_4_0::SchemaInfo::getTopLevelComponent
          (SchemaInfo *this,unsigned_short compCategory,XMLCh *compName,XMLCh *name,
          SchemaInfo **enclosingSchema)

{
  SchemaInfo *this_00;
  ulong local_68;
  XMLSize_t local_58;
  XMLSize_t i;
  XMLSize_t listSize;
  DOMElement *child;
  SchemaInfo *currentInfo;
  SchemaInfo **enclosingSchema_local;
  XMLCh *name_local;
  XMLCh *compName_local;
  unsigned_short compCategory_local;
  SchemaInfo *this_local;
  
  if (this->fSchemaRootElement == (DOMElement *)0x0) {
    this_local = (SchemaInfo *)0x0;
  }
  else {
    listSize = (XMLSize_t)getTopLevelComponent(this,compCategory,compName,name);
    if ((DOMElement *)listSize == (DOMElement *)0x0) {
      if (this->fIncludeInfoList == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
        local_68 = 0;
      }
      else {
        local_68 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::size
                             (&this->fIncludeInfoList->
                               super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>);
      }
      for (local_58 = 0; local_58 < local_68; local_58 = local_58 + 1) {
        this_00 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                            (&this->fIncludeInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>
                             ,local_58);
        if ((this_00 != this) &&
           (listSize = (XMLSize_t)getTopLevelComponent(this_00,compCategory,compName,name),
           (DOMElement *)listSize != (DOMElement *)0x0)) {
          *enclosingSchema = this_00;
          break;
        }
      }
    }
    this_local = (SchemaInfo *)listSize;
  }
  return (DOMElement *)this_local;
}

Assistant:

DOMElement*
SchemaInfo::getTopLevelComponent(const unsigned short compCategory,
                                 const XMLCh* const compName,
                                 const XMLCh* const name,
                                 SchemaInfo** enclosingSchema) {

    if (fSchemaRootElement == 0)
      return 0;

    SchemaInfo* currentInfo = this;
    DOMElement* child = getTopLevelComponent(compCategory, compName, name);

    if (child == 0) {

        XMLSize_t listSize = (fIncludeInfoList) ? fIncludeInfoList->size() : 0;

        for (XMLSize_t i=0; i < listSize; i++) {

            currentInfo = fIncludeInfoList->elementAt(i);

            if (currentInfo == this)
                continue;

            child = currentInfo->getTopLevelComponent(compCategory, compName, name);

            if (child != 0) {

                *enclosingSchema = currentInfo;
                break;
            }
        }
    }

    return child;
}